

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

ON_Interval ApproxSpectrumLTL(ON_Xform *L)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  int j;
  long lVar6;
  long lVar7;
  double *this;
  double *pdVar8;
  ON_Xform *pOVar9;
  double *pdVar10;
  int i;
  byte bVar11;
  double dVar12;
  ON_Interval OVar13;
  ON_Interval SpectrumHull;
  ON_Xform LTL;
  ON_Interval local_138;
  ON_Xform local_128;
  double local_a0 [11];
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  bVar11 = 0;
  this = local_a0;
  pdVar8 = (double *)L;
  pdVar10 = this;
  for (lVar6 = 0x10; uVar5 = local_48, dVar4 = local_a0[7], dVar3 = local_a0[6], dVar2 = local_a0[3]
      , dVar1 = local_a0[2], dVar12 = local_a0[1], lVar6 != 0; lVar6 = lVar6 + -1) {
    *pdVar10 = *pdVar8;
    pdVar8 = pdVar8 + 1;
    pdVar10 = pdVar10 + 1;
  }
  local_a0[1] = local_a0[4];
  local_a0[4] = dVar12;
  local_a0[2] = local_a0[8];
  local_a0[8] = dVar1;
  local_a0[3] = (double)local_40;
  local_40 = dVar2;
  local_a0[6] = local_a0[9];
  local_a0[9] = dVar3;
  local_a0[7] = (double)local_38;
  local_38 = dVar4;
  local_48 = local_30;
  local_30 = uVar5;
  ON_Xform::operator*(&local_128,(ON_Xform *)this,L);
  pOVar9 = &local_128;
  pdVar8 = this;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    *pdVar8 = pOVar9->m_xform[0][0];
    pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar11 * -2 + 1) * 8);
    pdVar8 = pdVar8 + (ulong)bVar11 * -2 + 1;
  }
  ON_Interval::ON_Interval((ON_Interval *)&local_128);
  lVar6 = 0;
  do {
    dVar12 = 0.0;
    lVar7 = 0;
    do {
      if (lVar6 != lVar7) {
        dVar12 = dVar12 + ABS(this[lVar7]);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    ON_Interval::ON_Interval(&local_138,local_a0[lVar6 * 5] - dVar12,dVar12 + local_a0[lVar6 * 5]);
    if (lVar6 == 0) {
      local_128.m_xform[0][0] = local_138.m_t[0];
      local_128.m_xform[0][1] = local_138.m_t[1];
    }
    else {
      ON_Interval::Union((ON_Interval *)&local_128,&local_138);
    }
    lVar6 = lVar6 + 1;
    this = this + 4;
  } while (lVar6 != 3);
  OVar13.m_t[0] = local_128.m_xform[0][0];
  OVar13.m_t[1] = local_128.m_xform[0][1];
  return (ON_Interval)OVar13.m_t;
}

Assistant:

static ON_Interval ApproxSpectrumLTL(const ON_Xform& L)
{
	// L.IsLinear() is a precondition

	// LTL = L^T * L
	ON_Xform LTL = L;
	LTL.Transpose();
	LTL = LTL * L;

	return  BoundEVals(LTL);
}